

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseDecltype(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  State *in_stack_00000078;
  undefined4 in_stack_ffffffffffffffe4;
  char one_char_token;
  ComplexityGuard in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar6;
  
  one_char_token = (char)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar5 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar5) {
    bVar6 = 0;
  }
  else {
    iVar1 = (in_RDI->parse_state).mangled_idx;
    iVar2 = (in_RDI->parse_state).out_cur_idx;
    iVar3 = (in_RDI->parse_state).prev_name_idx;
    uVar4 = *(undefined4 *)&(in_RDI->parse_state).field_0xc;
    bVar5 = ParseOneCharToken(in_stack_ffffffffffffffe8.state_,one_char_token);
    if ((((bVar5) &&
         (bVar5 = ParseCharClass((State *)CONCAT17(in_stack_ffffffffffffffff,
                                                   in_stack_fffffffffffffff8),(char *)in_RDI), bVar5
         )) && (bVar5 = ParseExpression(in_stack_00000078), bVar5)) &&
       (bVar5 = ParseOneCharToken(in_stack_ffffffffffffffe8.state_,one_char_token), bVar5)) {
      bVar6 = 1;
    }
    else {
      (in_RDI->parse_state).mangled_idx = iVar1;
      (in_RDI->parse_state).out_cur_idx = iVar2;
      (in_RDI->parse_state).prev_name_idx = iVar3;
      *(undefined4 *)&(in_RDI->parse_state).field_0xc = uVar4;
      bVar6 = 0;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return (bool)(bVar6 & 1);
}

Assistant:

static bool ParseDecltype(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'D') && ParseCharClass(state, "tT") &&
      ParseExpression(state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  return false;
}